

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
emplaceRealloc<slang::SmallVector<slang::ast::NetAlias,2ul>>
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *this,pointer pos,
          SmallVector<slang::ast::NetAlias,_2UL> *args)

{
  SmallVector<slang::ast::NetAlias,_2UL> *this_00;
  ulong uVar1;
  long lVar2;
  long lVar3;
  SmallVector<slang::ast::NetAlias,_2UL> *pSVar4;
  long lVar5;
  SmallVector<slang::ast::NetAlias,_2UL> *pSVar6;
  SmallVector<slang::ast::NetAlias,_2UL> *pSVar7;
  ulong uVar8;
  
  if (*(long *)(this + 8) == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  uVar8 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    uVar8 = 0x1745d1745d1745d;
  }
  lVar2 = *(long *)this;
  pSVar4 = (SmallVector<slang::ast::NetAlias,_2UL> *)operator_new(uVar8 * 0x58);
  this_00 = (SmallVector<slang::ast::NetAlias,_2UL> *)((long)pSVar4 + ((long)pos - lVar2));
  SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
            (this_00,&args->super_SmallVectorBase<slang::ast::NetAlias>);
  pSVar6 = *(SmallVector<slang::ast::NetAlias,_2UL> **)this;
  lVar3 = *(long *)(this + 8);
  lVar5 = lVar3 * 0x58;
  pSVar7 = pSVar4;
  if (pSVar6 + lVar3 == pos) {
    while (lVar3 != 0) {
      args = pSVar6;
      SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
                (pSVar7,&pSVar6->super_SmallVectorBase<slang::ast::NetAlias>);
      pSVar6 = pSVar6 + 1;
      lVar5 = lVar5 + -0x58;
      pSVar7 = pSVar7 + 1;
      lVar3 = lVar5;
    }
  }
  else {
    for (; pSVar6 != pos; pSVar6 = pSVar6 + 1) {
      args = pSVar6;
      SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
                (pSVar7,&pSVar6->super_SmallVectorBase<slang::ast::NetAlias>);
      pSVar7 = pSVar7 + 1;
    }
    pSVar6 = (SmallVector<slang::ast::NetAlias,_2UL> *)(*(long *)(this + 8) * 0x58 + *(long *)this);
    if (pSVar6 != pos) {
      pSVar7 = (SmallVector<slang::ast::NetAlias,_2UL> *)(((long)pos - lVar2) + (long)pSVar4);
      do {
        pSVar7 = pSVar7 + 1;
        args = pos;
        SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
                  (pSVar7,&pos->super_SmallVectorBase<slang::ast::NetAlias>);
        pos = pos + 1;
      } while (pos != pSVar6);
    }
  }
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
            ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *)this,
             (EVP_PKEY_CTX *)args);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar8;
  *(SmallVector<slang::ast::NetAlias,_2UL> **)this = pSVar4;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}